

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O0

int ATimes(void *Data,N_Vector v_vec,N_Vector z_vec)

{
  long lVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  UserData *ProbData;
  sunindextype N;
  sunindextype i;
  sunrealtype *s2;
  sunrealtype *s1;
  sunrealtype *z;
  sunrealtype *v;
  int opt;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long lVar7;
  int local_4;
  
  pdVar3 = (double *)N_VGetArrayPointer(in_RSI);
  opt = (int)((ulong)in_RDI >> 0x20);
  iVar2 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
  if (iVar2 == 0) {
    pdVar4 = (double *)N_VGetArrayPointer(in_RDX);
    iVar2 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
    if (iVar2 == 0) {
      pdVar5 = (double *)N_VGetArrayPointer(in_RDI[2]);
      iVar2 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
      if (iVar2 == 0) {
        pdVar6 = (double *)N_VGetArrayPointer(in_RDI[3]);
        iVar2 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
        if (iVar2 == 0) {
          lVar1 = *in_RDI;
          *pdVar4 = (*pdVar3 * 5.0 * *pdVar6 + -(pdVar3[1] * pdVar6[1])) / *pdVar5;
          for (lVar7 = 1; lVar7 < lVar1 + -1; lVar7 = lVar7 + 1) {
            pdVar4[lVar7] =
                 (-pdVar3[lVar7 + 1] * pdVar6[lVar7 + 1] +
                 -pdVar3[lVar7 + -1] * pdVar6[lVar7 + -1] + pdVar3[lVar7] * 5.0 * pdVar6[lVar7]) /
                 pdVar5[lVar7];
          }
          pdVar4[lVar1 + -1] =
               (-pdVar3[lVar1 + -2] * pdVar6[lVar1 + -2] +
               pdVar3[lVar1 + -1] * 5.0 * pdVar6[lVar1 + -1]) / pdVar5[lVar1 + -1];
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ATimes(void* Data, N_Vector v_vec, N_Vector z_vec)
{
  /* local variables */
  sunrealtype *v, *z, *s1, *s2;
  sunindextype i, N;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  v        = N_VGetArrayPointer(v_vec);
  if (check_flag(v, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  s1 = N_VGetArrayPointer(ProbData->s1);
  if (check_flag(s1, "N_VGetArrayPointer", 0)) { return 1; }
  s2 = N_VGetArrayPointer(ProbData->s2);
  if (check_flag(s2, "N_VGetArrayPointer", 0)) { return 1; }
  N = ProbData->N;

  /* perform product at the left domain boundary (note: v is zero at the boundary)*/
  z[0] = (FIVE * v[0] * s2[0] - v[1] * s2[1]) / s1[0];

  /* iterate through interior of the domain, performing product */
  for (i = 1; i < N - 1; i++)
  {
    z[i] = (-v[i - 1] * s2[i - 1] + FIVE * v[i] * s2[i] - v[i + 1] * s2[i + 1]) /
           s1[i];
  }

  /* perform product at the right domain boundary (note: v is zero at the boundary)*/
  z[N - 1] = (-v[N - 2] * s2[N - 2] + FIVE * v[N - 1] * s2[N - 1]) / s1[N - 1];

  /* return with success */
  return 0;
}